

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GeometryShaderLayeredRenderingBoundaryCondition::iterate
          (GeometryShaderLayeredRenderingBoundaryCondition *this)

{
  int iVar1;
  deUint32 dVar2;
  uint uVar3;
  undefined4 extraout_var;
  long lVar5;
  void *pvVar6;
  pointer pTVar7;
  TestError *this_00;
  uint uVar8;
  ulong uVar9;
  pointer_____offset_0x10___ *ppuVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  ulong local_2c8;
  uchar expectedData [4];
  ostringstream local_2b0 [112];
  ios_base local_240 [264];
  uchar buffer [256];
  long lVar4;
  
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
               ,0x138);
    ppuVar10 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])();
    iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar4 = CONCAT44(extraout_var,iVar1);
    (**(code **)(lVar4 + 0x78))(0x8ca9);
    memset(buffer,0,0x100);
    pTVar7 = (this->m_textures_info).
             super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_textures_info).
        super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish == pTVar7) {
      uVar11 = 0;
      lVar5 = 0;
    }
    else {
      uVar9 = 0;
      uVar12 = 1;
      do {
        (**(code **)(lVar4 + 0xb8))(pTVar7[uVar9].m_texture_target,pTVar7[uVar9].m_id);
        pTVar7 = (this->m_textures_info).
                 super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        (**(code **)(lVar4 + 0x1398))
                  (pTVar7[uVar9].m_texture_target,1,0x8058,4,4,pTVar7[uVar9].m_depth);
        pTVar7 = (this->m_textures_info).
                 super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        (**(code **)(lVar4 + 0x13c0))
                  (pTVar7[uVar9].m_texture_target,0,0,0,0,4,4,pTVar7[uVar9].m_depth,0x1908,0x1401,
                   buffer);
        dVar2 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar2,"Error configuring a texture object!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                        ,0x14f);
        pTVar7 = (this->m_textures_info).
                 super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar5 = (long)(this->m_textures_info).
                      super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7;
        uVar11 = lVar5 >> 4;
        bVar13 = uVar12 < uVar11;
        uVar9 = uVar12;
        uVar12 = (ulong)((int)uVar12 + 1);
      } while (bVar13);
    }
    pvVar6 = operator_new__(-(ulong)(uVar11 >> 0x3e != 0) | lVar5 >> 2);
    if (uVar11 != 0) {
      uVar3 = 1;
      lVar5 = 0;
      do {
        *(GLenum *)((long)pvVar6 + lVar5) = (&pTVar7->m_draw_buffer)[lVar5];
        uVar9 = (ulong)uVar3;
        lVar5 = lVar5 + 4;
        uVar3 = uVar3 + 1;
      } while (uVar9 < uVar11);
    }
    (**(code **)(lVar4 + 0x560))(uVar11 & 0xffffffff,pvVar6);
    operator_delete__(pvVar6);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Error setting draw buffers!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                    ,0x161);
    pTVar7 = (this->m_textures_info).
             super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_textures_info).
        super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish != pTVar7) {
      uVar3 = 1;
      uVar11 = 0;
      do {
        if (this->m_is_fbo_layered == true) {
          (**(code **)(lVar4 + 0x690))(0x8ca9,pTVar7[uVar11].m_draw_buffer,pTVar7[uVar11].m_id,0);
        }
        else {
          (**(code **)(lVar4 + 0x6b8))
                    (0x8ca9,pTVar7[uVar11].m_draw_buffer,pTVar7[uVar11].m_id,0,uVar3 - 1);
        }
        dVar2 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar2,"Error configuring framebuffer objects!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                        ,0x171);
        uVar11 = (ulong)uVar3;
        pTVar7 = (this->m_textures_info).
                 super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar3 = uVar3 + 1;
      } while (uVar11 < (ulong)((long)(this->m_textures_info).
                                      super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7 >> 4
                               ));
    }
    iVar1 = (**(code **)(lVar4 + 0x170))(0x8ca9);
    if (iVar1 == 0x8cd5) {
      uVar3 = 0;
      (**(code **)(lVar4 + 0x1a00))(0,0,4,4);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"Error setting up viewport!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                      ,0x182);
      (**(code **)(lVar4 + 0xd8))(this->m_vao_id);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"Error configuring vertex array object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                      ,0x187);
      (**(code **)(lVar4 + 0x1680))(this->m_po_id);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"Error using program object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                      ,0x18c);
      (**(code **)(lVar4 + 0x538))(this->m_draw_mode,0,this->m_n_points);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"Rendering failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                      ,400);
      (**(code **)(lVar4 + 0x78))(0x8ca8);
      pTVar7 = (this->m_textures_info).
               super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = (long)(this->m_textures_info).
                    super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7;
      if (lVar5 != 0) {
        uVar11 = lVar5 >> 4;
        uVar3 = pTVar7->m_depth;
        if (1 < uVar11) {
          uVar9 = 1;
          uVar8 = 2;
          do {
            if ((uint)pTVar7[uVar9].m_depth <= uVar3) {
              uVar3 = pTVar7[uVar9].m_depth;
            }
            uVar9 = (ulong)uVar8;
            uVar8 = uVar8 + 1;
          } while (uVar9 < uVar11);
        }
      }
      bVar13 = (this->m_textures_info).
               super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
               (this->m_textures_info).
               super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (bVar13) {
        local_2c8 = 0;
        do {
          if (uVar3 != 0) {
            uVar11 = 0;
            do {
              (**(code **)(lVar4 + 0x6b8))
                        (0x8ca8,0x8ce0,
                         (this->m_textures_info).
                         super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_2c8].m_id,0,uVar11);
              dVar2 = (**(code **)(lVar4 + 0x800))();
              glu::checkError(dVar2,"Could not set up read framebuffer!",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                              ,0x1ad);
              iVar1 = (**(code **)(lVar4 + 0x170))(0x8ca9);
              if (iVar1 != 0x8cd5) {
                _expectedData =
                     ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream(local_2b0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2b0,"Read FBO is incomplete: ",0x18);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[",1);
                std::ostream::_M_insert<unsigned_long>((ulong)local_2b0);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"]",1);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)expectedData,
                           (EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream(local_2b0);
                std::ios_base::~ios_base(local_240);
                this_00 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this_00,"Read FBO is incomplete.",(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                           ,0x1b7);
                goto LAB_00d094d2;
              }
              (**(code **)(lVar4 + 0x1a00))(0,0,4,4);
              (**(code **)(lVar4 + 0x1220))(0,0,4,4,0x1908,0x1401,buffer);
              dVar2 = (**(code **)(lVar4 + 0x800))();
              glu::checkError(dVar2,"Could not read pixels using glReadPixels()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                              ,0x1bf);
              (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[10])
                        (this,uVar11,expectedData,4);
              iVar1 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[9])
                                (this,4,4,4,buffer,expectedData,local_2c8,uVar11);
              if ((char)iVar1 == '\0') {
                tcu::TestContext::setTestResult
                          ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                           QP_TEST_RESULT_FAIL,"Fail");
                if (bVar13) {
                  return STOP;
                }
                goto LAB_00d093f2;
              }
              uVar8 = (int)uVar11 + 1;
              uVar11 = (ulong)uVar8;
            } while (uVar3 != uVar8);
          }
          local_2c8 = (ulong)((int)local_2c8 + 1);
          uVar11 = (long)(this->m_textures_info).
                         super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_textures_info).
                         super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4;
          bVar13 = local_2c8 < uVar11;
        } while (local_2c8 < uVar11);
      }
LAB_00d093f2:
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    _expectedData = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2b0,"Draw FBO is incomplete: ",0x18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[",1);
    std::ostream::_M_insert<unsigned_long>((ulong)local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)expectedData,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_2b0);
    std::ios_base::~ios_base(local_240);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Draw FBO is incomplete.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
               ,0x17c);
LAB_00d094d2:
    ppuVar10 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar10,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderLayeredRenderingBoundaryCondition::iterate(void)
{
	/* check if EXT_geometry_shader extension is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind draw framebuffer */
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_draw_id);

	/* Set up all textures */
	unsigned char buffer[m_width * m_height * m_max_depth * m_texture_components];

	memset(buffer, 0, sizeof(buffer));

	for (unsigned int i = 0; i < m_textures_info.size(); i++)
	{
		gl.bindTexture(m_textures_info[i].m_texture_target, m_textures_info[i].m_id);
		gl.texStorage3D(m_textures_info[i].m_texture_target, 1, GL_RGBA8, m_width, m_height,
						m_textures_info[i].m_depth);
		gl.texSubImage3D(m_textures_info[i].m_texture_target, 0, 0, 0, 0, m_width, m_height, m_textures_info[i].m_depth,
						 GL_RGBA, GL_UNSIGNED_BYTE, buffer);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring a texture object!");
	}

	/* Set up draw buffers */
	{
		glw::GLenum* drawBuffers = new glw::GLenum[m_textures_info.size()];

		for (unsigned int i = 0; i < m_textures_info.size(); i++)
		{
			drawBuffers[i] = m_textures_info[i].m_draw_buffer;
		}

		gl.drawBuffers((glw::GLsizei)m_textures_info.size(), drawBuffers);

		delete[] drawBuffers;
		drawBuffers = 0;
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting draw buffers!");

	/* Configure draw FBO so that it uses texture attachments */
	for (unsigned int i = 0; i < m_textures_info.size(); i++)
	{
		if (m_is_fbo_layered)
		{
			gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, m_textures_info[i].m_draw_buffer, m_textures_info[i].m_id,
								  0 /* level */);
		}
		else
		{
			gl.framebufferTextureLayer(GL_DRAW_FRAMEBUFFER, m_textures_info[i].m_draw_buffer, m_textures_info[i].m_id,
									   0 /* level */, i /* layer */);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring framebuffer objects!");
	} /* for (all textures considered) */

	/* Verify draw framebuffer is considered complete */
	glw::GLenum fboCompleteness = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

	if (fboCompleteness != GL_FRAMEBUFFER_COMPLETE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Draw FBO is incomplete: "
						   << "[" << fboCompleteness << "]" << tcu::TestLog::EndMessage;

		TCU_FAIL("Draw FBO is incomplete.");
	}

	/* Set up viewport */
	gl.viewport(0, 0, m_width, m_height);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting up viewport!");

	/** Bind a vertex array object */
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring vertex array object!");

	/* Render */
	gl.useProgram(m_po_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error using program object!");

	gl.drawArrays(m_draw_mode, 0, m_n_points);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed!");

	/* Bind read framebuffer object. */
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_read_id);

	/* Compare the rendered data against reference representation */
	unsigned int min_depth = 0;

	if (m_textures_info.size() > 0)
	{
		min_depth = m_textures_info[0].m_depth;

		for (unsigned int nTexture = 1; nTexture < m_textures_info.size(); nTexture++)
		{
			if (min_depth > (unsigned)m_textures_info[nTexture].m_depth)
			{
				min_depth = m_textures_info[nTexture].m_depth;
			}
		}
	}

	for (unsigned int nTexture = 0; nTexture < m_textures_info.size(); nTexture++)
	{
		for (unsigned int nLayer = 0; nLayer < min_depth; nLayer++)
		{
			/* Configure read FBO's color attachment */
			gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_textures_info[nTexture].m_id, 0,
									   nLayer);

			GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up read framebuffer!");

			/* Verify read framebuffer is considered complete */
			glw::GLenum _fboCompleteness = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

			if (_fboCompleteness != GL_FRAMEBUFFER_COMPLETE)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Read FBO is incomplete: "
								   << "[" << _fboCompleteness << "]" << tcu::TestLog::EndMessage;

				TCU_FAIL("Read FBO is incomplete.");
			}
			gl.viewport(0, 0, m_width, m_height);

			/* Read the rendered data */
			gl.readPixels(0 /* x */, 0 /* y */, m_width /* width */, m_height /* height */, GL_RGBA, GL_UNSIGNED_BYTE,
						  buffer);

			GLU_EXPECT_NO_ERROR(gl.getError(), "Could not read pixels using glReadPixels()");

			/* Retrieve reference color for layer */
			unsigned char expectedData[m_texture_components];

			getReferenceColor(nLayer, expectedData, m_texture_components);

			/* Compare the retrieved data with reference data */
			if (!comparePixels(m_width, m_height, m_texture_components, buffer, expectedData, nTexture, nLayer))
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			} /* if (data comparison failed) */
		}	 /* for (all layers) */
	}		  /* for (all texture objects) */

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}